

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdeclnode.cpp
# Opt level: O2

void __thiscall
FuncDeclNode::check(FuncDeclNode *this,
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                   *tables)

{
  string *name;
  pointer pmVar1;
  ArgNode *pAVar2;
  TypeNode *pTVar3;
  SequenceNode *pSVar4;
  FuncDeclNode *pFVar5;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *this_00;
  bool bVar6;
  SemanticException *pSVar7;
  pointer puVar8;
  allocator local_219;
  FuncDeclNode *local_218;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *local_210;
  pointer local_208;
  pointer local_200;
  string funcScope;
  SymbolInfo local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_178;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  name = &this->name;
  bVar6 = wasDeclared(tables,name);
  if (bVar6) {
    pSVar7 = (SemanticException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1d8.kind,"error: multiple definition of function \'",name);
    std::operator+(&local_178.first,&local_1d8.kind,"\'");
    SemanticException::SemanticException(pSVar7,&local_178.first);
    __cxa_throw(pSVar7,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
  }
  funcScope._M_dataplus._M_p = (pointer)&funcScope.field_2;
  funcScope._M_string_length = 0;
  funcScope.field_2._M_local_buf[0] = '\0';
  if ((long)(tables->
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(tables->
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x30) {
    std::__cxx11::string::assign((char *)&funcScope);
    pmVar1 = (tables->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string((string *)&local_70,"func",&local_219);
    std::__cxx11::string::string
              ((string *)&local_90,
               (string *)
               &((this->returnType)._M_t.
                 super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t.
                 super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
                 super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl)->name);
    std::__cxx11::string::string((string *)&local_b0,(string *)&funcScope);
    SymbolInfo::SymbolInfo(&local_1d8,&local_70,&local_90,&local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
              (&local_178,name,&local_1d8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)(pmVar1 + -1),&local_178);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::~pair(&local_178);
    SymbolInfo::~SymbolInfo(&local_1d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&funcScope);
    local_178.first.field_2._8_8_ = &local_178.first._M_string_length;
    local_178.first._M_dataplus._M_p = (pointer)0x0;
    local_178.first._M_string_length = 0;
    local_178.first.field_2._M_allocated_capacity = 0;
    local_178.second.kind._M_string_length = 0;
    local_178.second.kind._M_dataplus._M_p = (pointer)local_178.first.field_2._8_8_;
    std::
    vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
    ::
    emplace_back<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>
              ((vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
                *)tables,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                *)&local_178);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                 *)&local_178);
    puVar8 = (this->args).
             super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_208 = (this->args).
                super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_218 = this;
    local_210 = tables;
    while( true ) {
      this_00 = local_210;
      pFVar5 = local_218;
      if (puVar8 == local_208) {
        pTVar3 = (local_218->returnType)._M_t.
                 super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t.
                 super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
                 super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl;
        (**(code **)((long)(pTVar3->super_ASTNode)._vptr_ASTNode + 0x28))(pTVar3,local_210);
        pSVar4 = (pFVar5->body)._M_t.
                 super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>._M_t.
                 super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
                 super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl;
        (**(code **)((long)(pSVar4->super_ASTNode)._vptr_ASTNode + 0x28))(pSVar4,this_00);
        std::
        vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
        ::pop_back(this_00);
        return;
      }
      bVar6 = wasDeclared(local_210,
                          &(((puVar8->_M_t).
                             super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
                             super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                             super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->super_VarNode).
                           name);
      if (bVar6) break;
      pmVar1 = (this_00->
               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pAVar2 = (puVar8->_M_t).super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
               super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
               super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl;
      std::__cxx11::string::string((string *)&local_d0,"var",(allocator *)&funcScope);
      local_200 = puVar8;
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 ((long)(((puVar8->_M_t).
                          super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
                          super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                          super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->type)._M_t.
                        super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_> + 0x10));
      std::__cxx11::string::string((string *)&local_50,"local",&local_219);
      SymbolInfo::SymbolInfo(&local_1d8,&local_d0,&local_f0,&local_50);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
                (&local_178,&(pAVar2->super_VarNode).name,&local_1d8);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                  *)(pmVar1 + -1),&local_178);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
      ::~pair(&local_178);
      SymbolInfo::~SymbolInfo(&local_1d8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      puVar8 = local_200 + 1;
    }
    pSVar7 = (SemanticException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1d8.kind,"error: multiple definition of \'",
                   &(((puVar8->_M_t).super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>.
                      _M_t.super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                      super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->super_VarNode).name);
    std::operator+(&local_178.first,&local_1d8.kind,"\'");
    SemanticException::SemanticException(pSVar7,&local_178.first);
    __cxa_throw(pSVar7,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)&funcScope);
  pSVar7 = (SemanticException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_1d8.kind,"error: function \'",name);
  std::operator+(&local_178.first,&local_1d8.kind,"\' can only be declared in the global scope");
  SemanticException::SemanticException(pSVar7,&local_178.first);
  __cxa_throw(pSVar7,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FuncDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, name)) {
        throw SemanticException("error: multiple definition of function '" + name + "'");
    } else {
        auto funcScope = std::string();
        if (tables.size() == 1) {
            funcScope = "global";
        } else {
            funcScope = "local"; // this is an error
            // TODO: Need to handle methods
            throw SemanticException("error: function '" + name + "' can only be declared in the global scope");
        }
        tables.back().emplace(std::make_pair(name, SymbolInfo("func", returnType->name, funcScope)));
//        std::cout << "new func added to table: named " << name << ", ret type: "
//                  << returnType->name << ", scope: " << funcScope << "\n";
    }

    // make a new scope for the args

    tables.push_back(SymbolTable());

    for (const auto& a : args) {
        if (wasDeclared(tables, a->name)) {
            throw SemanticException("error: multiple definition of '" + a->name + "'");
        } else {
            tables.back().emplace(std::make_pair(a->name, SymbolInfo("var", a->type->name, "local")));
//            std::cout << "\tnew var (arg) added to table: named " << a->name << ", type: "
//                      << a->type->name << ", scope: " << "local" << "\n";
        }
    }

    returnType->check(tables);
    body->check(tables);

    tables.pop_back();
}